

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allnodes.cpp
# Opt level: O3

int define_till_no_keyword
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *b,int i,datanode *node,int width)

{
  pointer pcVar1;
  int iVar2;
  pointer pbVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  string type;
  string IOWG;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pbVar3 = (b->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)i;
  local_70[0] = local_60;
  pcVar1 = pbVar3[uVar6 - 1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + pbVar3[uVar6 - 1]._M_string_length);
  pbVar3 = (b->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_90[0] = local_80;
  pcVar1 = pbVar3[uVar6]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + pbVar3[uVar6]._M_string_length);
  pbVar3 = (b->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (uVar6 < ((long)(b->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) - 5U) {
    lVar5 = uVar6 * 0x20 + 0x40;
    iVar2 = i + 1;
    do {
      i = iVar2;
      iVar2 = std::__cxx11::string::compare((char *)((long)&pbVar3[-1]._M_dataplus._M_p + lVar5));
      if ((((iVar2 == 0) ||
           (iVar2 = std::__cxx11::string::compare
                              ((char *)((long)&(b->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start[-1].
                                               _M_dataplus._M_p + lVar5)), iVar2 == 0)) ||
          (iVar2 = std::__cxx11::string::compare
                             ((char *)((long)&(b->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start[-1].
                                              _M_dataplus._M_p + lVar5)), iVar2 == 0)) ||
         ((iVar2 = std::__cxx11::string::compare
                             ((char *)((long)&(b->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start[-1].
                                              _M_dataplus._M_p + lVar5)), iVar2 == 0 ||
          (iVar2 = std::__cxx11::string::compare
                             ((char *)((long)&(((b->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar5)), iVar2 == 0)))) break;
      lVar4 = std::__cxx11::string::find
                        ((char *)((long)&(b->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus.
                                         _M_p + lVar5),0x10d0c3,0);
      if (lVar4 == -1) {
        std::__cxx11::string::_M_assign((string *)(node + nodepointer));
      }
      else {
        std::__cxx11::string::substr
                  ((ulong)local_50,
                   (long)&(b->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p + lVar5);
        std::__cxx11::string::operator=((string *)(node + nodepointer),(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      std::__cxx11::string::_M_assign((string *)&node[nodepointer].typeofIOWG);
      std::__cxx11::string::_M_assign((string *)&node[nodepointer].type);
      uVar6 = uVar6 + 1;
      node[nodepointer].width = width;
      node[nodepointer].delay = 0.0;
      nodepointer = nodepointer + 1;
      pbVar3 = (b->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x20;
      iVar2 = i + 1;
    } while (uVar6 < ((long)(b->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) - 5U);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return i;
}

Assistant:

int define_till_no_keyword(vector<string>&b, int i, struct datanode *node, int width) {

string IOWG = b[i - 1];
string type = b[i];
while (i < b.size()-5)
{
	i++;

			if (b[i] == "input" || b[i] == "output" || b[i] == "wire" || b[i] == "register" || b[i + 1] == "=")
			{
				return i;
			}
			else
			{
				if (b[i].find(",") != string::npos)
				{
					node[nodepointer].name = b[i].substr(0, b[i].length() - 1);
				}
				else
					node[nodepointer].name = b[i];
				
				node[nodepointer].typeofIOWG = IOWG;
				node[nodepointer].type = type;
				node[nodepointer].width = width;
				node[nodepointer].delay = 0.0;
				nodepointer++;
			}
			
}
return i;
}